

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigOper.c
# Opt level: O1

Aig_Obj_t * Aig_CreateAnd(Aig_Man_t *p,int nVars)

{
  Aig_Obj_t *p1;
  Aig_Obj_t *p0;
  int i;
  
  p0 = p->pConst1;
  if (0 < nVars) {
    i = 0;
    do {
      p1 = Aig_IthVar(p,i);
      p0 = Aig_And(p,p0,p1);
      i = i + 1;
    } while (nVars != i);
  }
  return p0;
}

Assistant:

Aig_Obj_t * Aig_CreateAnd( Aig_Man_t * p, int nVars )
{
    Aig_Obj_t * pFunc;
    int i;
    pFunc = Aig_ManConst1( p );
    for ( i = 0; i < nVars; i++ )
        pFunc = Aig_And( p, pFunc, Aig_IthVar(p, i) );
    return pFunc;
}